

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

bool __thiscall XmlRpc::XmlRpcValue::operator==(XmlRpcValue *this,XmlRpcValue *other)

{
  tm *ptVar1;
  tm *ptVar2;
  pointer pcVar3;
  pointer pXVar4;
  bool bVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  pointer __n;
  pointer __s2;
  pointer __s1;
  _Self __tmp;
  pointer this_00;
  _Self __tmp_1;
  pointer other_00;
  
  if (this->_type == other->_type) {
    bVar5 = true;
    switch(this->_type) {
    case TypeBoolean:
      return (this->_value).asBool == (other->_value).asBool;
    case TypeInt:
      return (this->_value).asInt == (other->_value).asInt;
    case TypeDouble:
      return (bool)(-((other->_value).asDouble == (this->_value).asDouble) & 1);
    case TypeString:
      __n = (pointer)((this->_value).asString)->_M_string_length;
      if (__n == (((other->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_finish) {
        if (__n == (pointer)0x0) {
          return true;
        }
        __s2 = (((other->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl
               .super__Vector_impl_data._M_start;
        __s1 = (((this->_value).asString)->_M_dataplus)._M_p;
LAB_0024e752:
        iVar6 = bcmp(__s1,__s2,(size_t)__n);
        return iVar6 == 0;
      }
      break;
    case TypeDateTime:
      ptVar2 = (this->_value).asTime;
      ptVar1 = (other->_value).asTime;
      if ((((ptVar2->tm_sec == ptVar1->tm_sec) && (ptVar2->tm_min == ptVar1->tm_min)) &&
          (ptVar2->tm_hour == ptVar1->tm_hour)) &&
         ((ptVar2->tm_mday == ptVar1->tm_mday && (ptVar2->tm_mon == ptVar1->tm_mon)))) {
        return ptVar2->tm_year == ptVar1->tm_year;
      }
      break;
    case TypeBase64:
      __s1 = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
      pcVar3 = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      __n = pcVar3 + -(long)__s1;
      __s2 = (((other->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
      if (__n == (((other->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_finish + -(long)__s2) {
        if (pcVar3 == __s1) {
          return true;
        }
        goto LAB_0024e752;
      }
      break;
    case TypeArray:
      this_00 = (((this->_value).asArray)->
                super__Vector_base<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pXVar4 = (((this->_value).asArray)->
               super__Vector_base<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      other_00 = (((other->_value).asArray)->
                 super__Vector_base<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      if ((long)pXVar4 - (long)this_00 ==
          (long)(((other->_value).asArray)->
                super__Vector_base<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)other_00) {
        while( true ) {
          if (this_00 == pXVar4) {
            return bVar5;
          }
          bVar5 = operator==(this_00,other_00);
          if (!bVar5) break;
          this_00 = this_00 + 1;
          other_00 = other_00 + 1;
        }
        return bVar5;
      }
      break;
    case TypeStruct:
      ptVar2 = (this->_value).asTime;
      if (ptVar2->tm_gmtoff == ((other->_value).asTime)->tm_gmtoff) {
        p_Var7 = *(_Rb_tree_node_base **)&ptVar2->tm_wday;
        if (p_Var7 == (_Rb_tree_node_base *)&ptVar2->tm_hour) {
          return true;
        }
        p_Var8 = *(_Rb_tree_node_base **)&((other->_value).asTime)->tm_wday;
        do {
          bVar5 = operator==((XmlRpcValue *)(p_Var7 + 2),(XmlRpcValue *)(p_Var8 + 2));
          if (!bVar5) {
            return bVar5;
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var7 != (_Rb_tree_node_base *)&ptVar2->tm_hour);
        return bVar5;
      }
      break;
    default:
      goto switchD_0024e621_default;
    }
  }
  bVar5 = false;
switchD_0024e621_default:
  return bVar5;
}

Assistant:

bool XmlRpcValue::operator==(XmlRpcValue const& other) const
  {
    if (_type != other._type)
      return false;

    switch (_type) {
      case TypeBoolean:  return ( !_value.asBool && !other._value.asBool) ||
                                ( _value.asBool && other._value.asBool);
      case TypeInt:      return _value.asInt == other._value.asInt;
      case TypeDouble:   return _value.asDouble == other._value.asDouble;
      case TypeDateTime: return tmEq(*_value.asTime, *other._value.asTime);
      case TypeString:   return *_value.asString == *other._value.asString;
      case TypeBase64:   return *_value.asBinary == *other._value.asBinary;
      case TypeArray:    return *_value.asArray == *other._value.asArray;

      // The map<>::operator== requires the definition of value< for kcc
      case TypeStruct:   //return *_value.asStruct == *other._value.asStruct;
        {
          if (_value.asStruct->size() != other._value.asStruct->size())
            return false;
          
          ValueStruct::const_iterator it1=_value.asStruct->begin();
          ValueStruct::const_iterator it2=other._value.asStruct->begin();
          while (it1 != _value.asStruct->end()) {
            const XmlRpcValue& v1 = it1->second;
            const XmlRpcValue& v2 = it2->second;
            if ( ! (v1 == v2))
              return false;
            it1++;
            it2++;
          }
          return true;
        }
      default: break;
    }
    return true;    // Both invalid values ...
  }